

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O1

Client * __thiscall
PoolList<Client>::append<Server&,Server::Client&,Address_const&,Client::ICallback&,Settings&>
          (PoolList<Client> *this,Server *a,Client *b,Address *c,ICallback *d,Settings *e)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Client *this_00;
  PoolList<Client> *pPVar4;
  
  this_00 = allocateFreeItem(this);
  Client::Client(this_00,a,b,c,d,e);
  pIVar1 = (this->_end).item;
  pIVar2 = this->freeItem;
  this->freeItem = pIVar2->prev;
  pIVar3 = pIVar1->prev;
  pIVar2->prev = pIVar3;
  pPVar4 = this;
  if (pIVar3 != (Item *)0x0) {
    pPVar4 = (PoolList<Client> *)pIVar1->prev;
  }
  (pPVar4->_begin).item = pIVar2;
  pIVar2->next = pIVar1;
  pIVar1->prev = pIVar2;
  this->_size = this->_size + 1;
  return this_00;
}

Assistant:

T& append(A a, B b, C c, D d, E e) {return linkFreeItem(new (allocateFreeItem()) T(a, b, c, d, e));}